

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadDsd.c
# Opt level: O2

Abc_Obj_t * Io_ReadDsd_rec(Abc_Ntk_t *pNtk,char *pCur,char *pSop)

{
  char cVar1;
  uint nVars;
  Abc_Obj_t *pAVar2;
  size_t sVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  char *pSop_00;
  ulong uVar6;
  ulong uVar7;
  int TypeExor;
  char *pParts [32];
  
  cVar1 = *pCur;
  if (cVar1 == '(') {
    sVar3 = strlen(pCur);
    if (pCur[sVar3 - 1] != ')') {
      __assert_fail("pCur[strlen(pCur)-1] == \')\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadDsd.c"
                    ,0x9e,"Abc_Obj_t *Io_ReadDsd_rec(Abc_Ntk_t *, char *, char *)");
    }
    pCur[sVar3 - 1] = '\0';
    nVars = Io_ReadDsdStrSplit(pCur + 1,pParts,&TypeExor);
    if (nVars != 0) {
      pAVar2 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
      uVar7 = 0;
      if (0 < (int)nVars) {
        uVar7 = (ulong)nVars;
      }
      uVar6 = 0;
      if (pSop == (char *)0x0) {
        for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          pAVar4 = Io_ReadDsd_rec(pNtk,pParts[uVar6],(char *)0x0);
          if (pAVar4 == (Abc_Obj_t *)0x0) {
            return (Abc_Obj_t *)0x0;
          }
          Abc_ObjAddFanin(pAVar2,pAVar4);
        }
      }
      else {
        for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          pAVar4 = Io_ReadDsd_rec(pNtk,pParts[uVar6],(char *)0x0);
          if (pAVar4 == (Abc_Obj_t *)0x0) {
            return (Abc_Obj_t *)0x0;
          }
          Abc_ObjAddFanin(pAVar2,pAVar4);
        }
      }
      if (pSop == (char *)0x0) {
        if (TypeExor == 0) {
          pcVar5 = Abc_SopCreateAnd((Mem_Flex_t *)pNtk->pManFunc,nVars,(int *)0x0);
        }
        else {
          pcVar5 = Abc_SopCreateXorSpecial((Mem_Flex_t *)pNtk->pManFunc,nVars);
        }
      }
      else {
        pcVar5 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,pSop);
      }
      (pAVar2->field_5).pData = pcVar5;
      return pAVar2;
    }
    Abc_NtkDelete(pNtk);
  }
  else {
    if (cVar1 == '!') {
      pAVar2 = Io_ReadDsd_rec(pNtk,pCur + 1,(char *)0x0);
      pAVar2 = Abc_NtkCreateNodeInv(pNtk,pAVar2);
      return pAVar2;
    }
    pcVar5 = pCur;
    if ((byte)(cVar1 + 0x9fU) < 0x1a) {
      if (pCur[1] == '\0') {
        pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vPis,(uint)(byte)(cVar1 + 0x9fU));
        return pAVar2;
      }
      __assert_fail("*(pCur+1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadDsd.c"
                    ,0xc6,"Abc_Obj_t *Io_ReadDsd_rec(Abc_Ntk_t *, char *, char *)");
    }
    while ((byte)(cVar1 - 0x30U) < 10 || (byte)(cVar1 + 0xbfU) < 6) {
      cVar1 = pcVar5[1];
      pcVar5 = pcVar5 + 1;
    }
    if (cVar1 == '(') {
      *pcVar5 = '\0';
      pSop_00 = Abc_SopFromTruthHex(pCur);
      *pcVar5 = '(';
      pAVar2 = Io_ReadDsd_rec(pNtk,pcVar5,pSop_00);
      free(pSop_00);
      return pAVar2;
    }
    puts("Cannot find the end of hexidecimal truth table.");
  }
  return (Abc_Obj_t *)0x0;
}

Assistant:

Abc_Obj_t * Io_ReadDsd_rec( Abc_Ntk_t * pNtk, char * pCur, char * pSop )
{
    Abc_Obj_t * pObj, * pFanin;
    char * pEnd, * pParts[32];
    int i, nParts, TypeExor;

    // consider complemented formula
    if ( *pCur == '!' )
    {
        pObj = Io_ReadDsd_rec( pNtk, pCur + 1, NULL );
        return Abc_NtkCreateNodeInv( pNtk, pObj );
    }
    if ( *pCur == '(' )
    {
        assert( pCur[strlen(pCur)-1] == ')' );
        pCur[strlen(pCur)-1] = 0;
        nParts = Io_ReadDsdStrSplit( pCur+1, pParts, &TypeExor );
        if ( nParts == 0 )
        {
            Abc_NtkDelete( pNtk );
            return NULL;
        }
        pObj = Abc_NtkCreateNode( pNtk );
        if ( pSop )
        {
//            for ( i = nParts - 1; i >= 0; i-- )
            for ( i = 0; i < nParts; i++ )
            {
                pFanin = Io_ReadDsd_rec( pNtk, pParts[i], NULL );
                if ( pFanin == NULL )
                    return NULL;
                Abc_ObjAddFanin( pObj, pFanin );
            }
        }
        else
        {
            for ( i = 0; i < nParts; i++ )
            {
                pFanin = Io_ReadDsd_rec( pNtk, pParts[i], NULL );
                if ( pFanin == NULL )
                    return NULL;
                Abc_ObjAddFanin( pObj, pFanin );
            }
        }
        if ( pSop )
            pObj->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, pSop );
        else if ( TypeExor )
            pObj->pData = Abc_SopCreateXorSpecial( (Mem_Flex_t *)pNtk->pManFunc, nParts );
        else
            pObj->pData = Abc_SopCreateAnd( (Mem_Flex_t *)pNtk->pManFunc, nParts, NULL );
        return pObj;
    }
    if ( *pCur >= 'a' && *pCur <= 'z' )
    {
        assert( *(pCur+1) == 0 );
        return Abc_NtkPi( pNtk, *pCur - 'a' );
    }

    // skip hex truth table
    pEnd = pCur;
    while ( (*pEnd >= '0' && *pEnd <= '9') || (*pEnd >= 'A' && *pEnd <= 'F') )
        pEnd++;
    if ( *pEnd != '(' )
    {
        printf( "Cannot find the end of hexidecimal truth table.\n" );
        return NULL;
    }

    // parse the truth table
    *pEnd = 0;
    pSop = Abc_SopFromTruthHex( pCur );
    *pEnd = '(';
    pObj = Io_ReadDsd_rec( pNtk, pEnd, pSop );
    ABC_FREE( pSop );
    return pObj;
}